

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

size_t xmlDictSetLimit(xmlDictPtr dict,size_t limit)

{
  size_t ret;
  size_t limit_local;
  xmlDictPtr dict_local;
  
  if (dict == (xmlDictPtr)0x0) {
    dict_local = (xmlDictPtr)0x0;
  }
  else {
    dict_local = (xmlDictPtr)dict->limit;
    dict->limit = limit;
  }
  return (size_t)dict_local;
}

Assistant:

size_t
xmlDictSetLimit(xmlDictPtr dict, size_t limit) {
    size_t ret;

    if (dict == NULL)
	return(0);
    ret = dict->limit;
    dict->limit = limit;
    return(ret);
}